

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O1

void la_dgemv_tos(int m,int n,double *a,int lda,double *x,int incx,double *y,int incy)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  double dVar5;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xba,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xbb,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (y == (double *)0x0) {
    __assert_fail("y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xbc,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (x == y) {
    __assert_fail("x != y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xbd,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if ((lda < 1) || (lda < n)) {
    __assert_fail("lda >= 1 && lda >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xbe,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (incx < 1) {
    __assert_fail("incx > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xbf,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (incy < 1) {
    __assert_fail("incy > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xc0,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (0 < n) {
    uVar1 = 0;
    do {
      dVar5 = 0.0;
      pdVar2 = x;
      uVar3 = (ulong)(uint)m;
      pdVar4 = a;
      if (0 < m) {
        do {
          dVar5 = dVar5 + *pdVar4 * *pdVar2;
          uVar3 = uVar3 - 1;
          pdVar2 = pdVar2 + (uint)incx;
          pdVar4 = pdVar4 + (uint)lda;
        } while (uVar3 != 0);
      }
      y[uVar1 * (uint)incy] = dVar5;
      uVar1 = uVar1 + 1;
      a = a + 1;
    } while (uVar1 != (uint)n);
  }
  return;
}

Assistant:

void la_dgemv_tos(
        int m, int n,
        const double *a, int lda,
        const double *x, int incx,
        double *y, int incy)
{
    assert(a);
    assert(x);
    assert(y);
    assert(x != y);
    assert(lda >= 1 && lda >= n);
    assert(incx > 0);
    assert(incy > 0);

    for (int i = 0; i < n; i++) {
        double yi = 0.0;
        for (int j = 0; j < m; j++) {
            yi += a[j * lda + i] * x[j * incx];
        }
        y[i * incy] = yi;
    }
}